

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::GeometryHelper_MakeQL_RectParallelepiped
          (X3DImporter *this,aiVector3D *pSize,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar3 = pSize->x * 0.5;
  fVar4 = -fVar3;
  fVar5 = pSize->y * 0.5;
  fVar6 = -fVar5;
  fVar8 = pSize->z * 0.5;
  fVar7 = -fVar8;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar4;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar5;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var2[1]._M_next = fVar3;
  *(float *)((long)&p_Var2[1]._M_next + 4) = fVar6;
  *(float *)&p_Var2[1]._M_prev = fVar7;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void X3DImporter::GeometryHelper_MakeQL_RectParallelepiped(const aiVector3D& pSize, std::list<aiVector3D>& pVertices)
{
	MESH_RectParallelepiped_CREATE_VERT;
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 3, 2, 1, 0);// front
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 6, 7, 4, 5);// back
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 3, 0, 4);// left
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 2, 6, 5, 1);// right
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 0, 1, 5, 4);// top
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 6, 2, 3);// bottom
}